

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_<float,int,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  long lVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble lVar16;
  longdouble lVar17;
  double dVar18;
  ulong local_a0;
  
  lVar13 = (long)Xc_indptr[col_num];
  lVar4 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar12 = ix_arr + st;
  puVar11 = ix_arr + end + 1;
  uVar5 = (long)puVar11 - (long)puVar12 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar8 = uVar5 >> 1;
      uVar6 = ~uVar8 + uVar5;
      uVar5 = uVar8;
      if (puVar12[uVar8] < (ulong)(long)Xc_ind[lVar13]) {
        puVar12 = puVar12 + uVar8 + 1;
        uVar5 = uVar6;
      }
    } while (0 < (long)uVar5);
  }
  if ((puVar12 != puVar11) && (lVar4 != lVar13)) {
    iVar2 = Xc_ind[lVar4 + -1];
    local_a0 = (end - st) + 1;
    lVar16 = (longdouble)0;
    uVar5 = 0;
    lVar17 = lVar16;
    while (uVar6 = *puVar12, uVar6 <= (ulong)(long)iVar2) {
      piVar1 = Xc_ind + lVar13;
      iVar3 = *piVar1;
      if (iVar3 == (int)uVar6) {
        if ((uint)ABS(Xc[lVar13]) < 0x7f800000) {
          uVar5 = uVar5 + 1;
          lVar16 = ((longdouble)Xc[lVar13] - lVar16) /
                   ((longdouble)(long)uVar5 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar5 < 0]) +
                   lVar16;
          lVar14 = in_ST1;
          fmal();
          lVar17 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = lVar14;
        }
        else {
          local_a0 = local_a0 - 1;
        }
        if ((puVar12 == ix_arr + end) || (lVar13 == lVar4 + -1)) break;
        piVar7 = piVar1 + 1;
        puVar12 = puVar12 + 1;
        uVar6 = (long)Xc_ind + (lVar4 * 4 - (long)piVar7) >> 2;
        if (0 < (long)uVar6) {
          do {
            uVar8 = uVar6 >> 1;
            uVar9 = ~uVar8 + uVar6;
            uVar6 = uVar8;
            if ((ulong)(long)piVar7[uVar8] < *puVar12) {
              piVar7 = piVar7 + uVar8 + 1;
              uVar6 = uVar9;
            }
          } while (0 < (long)uVar6);
        }
LAB_0028b34c:
        lVar13 = (long)piVar7 - (long)Xc_ind >> 2;
      }
      else {
        if (iVar3 <= (int)uVar6) {
          piVar7 = piVar1 + 1;
          uVar8 = (long)Xc_ind + (lVar4 * 4 - (long)(piVar1 + 1)) >> 2;
          while (0 < (long)uVar8) {
            uVar9 = uVar8 >> 1;
            uVar10 = ~uVar9 + uVar8;
            uVar8 = uVar9;
            if ((ulong)(long)piVar7[uVar9] < uVar6) {
              piVar7 = piVar7 + uVar9 + 1;
              uVar8 = uVar10;
            }
          }
          goto LAB_0028b34c;
        }
        puVar12 = puVar12 + 1;
        uVar6 = (long)puVar11 - (long)puVar12 >> 3;
        while (0 < (long)uVar6) {
          uVar8 = uVar6 >> 1;
          uVar9 = ~uVar8 + uVar6;
          uVar6 = uVar8;
          if (puVar12[uVar8] < (ulong)(long)iVar3) {
            puVar12 = puVar12 + uVar8 + 1;
            uVar6 = uVar9;
          }
        }
      }
      if ((puVar12 == puVar11) || (lVar13 == lVar4)) break;
    }
    if (uVar5 != 0) {
      if (uVar5 < local_a0) {
        lVar14 = (longdouble)(long)local_a0 + (longdouble)(float)(&DAT_0036e0d8)[(long)local_a0 < 0]
        ;
        lVar15 = ((longdouble)(long)uVar5 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar5 < 0]) /
                 lVar14;
        lVar17 = lVar16 * lVar16 *
                 ((longdouble)1 - lVar15) *
                 ((longdouble)(long)uVar5 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar5 < 0]) +
                 lVar17;
        lVar16 = lVar16 * lVar15;
      }
      else {
        lVar14 = (longdouble)(long)local_a0 + (longdouble)(float)(&DAT_0036e0d8)[(long)local_a0 < 0]
        ;
      }
      *x_mean = (double)lVar16;
      dVar18 = (double)SQRT(lVar17 / lVar14);
      goto LAB_0028b44a;
    }
  }
  *x_mean = 0.0;
  dVar18 = 0.0;
LAB_0028b44a:
  *x_sd = dVar18;
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}